

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::root_name(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  path *ppVar2;
  ulong uVar3;
  value_type *pvVar4;
  undefined1 local_48 [8];
  iterator itr;
  path *this_local;
  
  itr.m_pos = (size_type)this;
  begin((iterator *)local_48,this);
  ppVar2 = (path *)std::__cxx11::string::size();
  if ((itr.m_path_ptr != ppVar2) && (uVar3 = std::__cxx11::string::size(), 1 < uVar3)) {
    pvVar4 = (value_type *)std::__cxx11::string::operator[]((ulong)local_48);
    bVar1 = anon_unknown.dwarf_f716::is_separator(*pvVar4);
    if (bVar1) {
      pvVar4 = (value_type *)std::__cxx11::string::operator[]((ulong)local_48);
      bVar1 = anon_unknown.dwarf_f716::is_separator(*pvVar4);
      if (bVar1) {
        path(__return_storage_ptr__,(path *)local_48);
        goto LAB_00119d20;
      }
    }
  }
  path(__return_storage_ptr__);
LAB_00119d20:
  iterator::~iterator((iterator *)local_48);
  return __return_storage_ptr__;
}

Assistant:

path path::root_name() const
  {
    iterator itr(begin());

    return (itr.m_pos != m_pathname.size()
      && (
          (itr.m_element.m_pathname.size() > 1
            && is_separator(itr.m_element.m_pathname[0])
            && is_separator(itr.m_element.m_pathname[1])
   )
#       ifdef BOOST_WINDOWS_API
        || itr.m_element.m_pathname[itr.m_element.m_pathname.size()-1] == colon
#       endif
  ))
      ? itr.m_element
      : path();
  }